

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

void mtbdd_refs_mark_task_WRAP(WorkerP *w,Task *__dq_head,TD_mtbdd_refs_mark_task *t)

{
  Task *__dq_head_00;
  long lVar1;
  long lVar2;
  Worker *pWVar3;
  mtbdd_refs_task_t arg_1;
  ulong uVar4;
  long in_FS_OFFSET;
  
  if (w->end != __dq_head) {
    lVar1 = **(long **)(in_FS_OFFSET + -0x18);
    lVar2 = (*(long **)(in_FS_OFFSET + -0x18))[2];
    __dq_head->f = mtbdd_refs_mark_p_par_WRAP;
    __dq_head->thief = (_Worker *)0x1;
    *(long *)__dq_head->d = lVar1;
    *(long *)(__dq_head->d + 8) = lVar2 - lVar1 >> 3;
    pWVar3 = w->_public;
    if (w->allstolen == '\0') {
      if (pWVar3->movesplit != '\0') {
        mtbdd_refs_mark_task_CALL_cold_1();
      }
    }
    else {
      if (pWVar3->movesplit != '\0') {
        pWVar3->movesplit = '\0';
      }
      uVar4 = (long)__dq_head - (long)w->dq;
      LOCK();
      (pWVar3->ts).v =
           (uVar4 >> 6 & 0xffffffff | (uVar4 & 0xffffffffffffffc0) << 0x1a) + 0x100000000;
      UNLOCK();
      pWVar3->allstolen = '\0';
      w->split = __dq_head + 1;
      w->allstolen = '\0';
    }
    __dq_head_00 = __dq_head + 1;
    if (w->end != __dq_head_00) {
      lVar1 = *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x18);
      lVar2 = *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x28);
      __dq_head[1].f = mtbdd_refs_mark_r_par_WRAP;
      __dq_head[1].thief = (_Worker *)0x1;
      *(long *)__dq_head[1].d = lVar1;
      *(long *)(__dq_head[1].d + 8) = lVar2 - lVar1 >> 3;
      pWVar3 = w->_public;
      if (w->allstolen == '\0') {
        if (pWVar3->movesplit != '\0') {
          mtbdd_refs_mark_task_CALL_cold_2();
        }
      }
      else {
        if (pWVar3->movesplit != '\0') {
          pWVar3->movesplit = '\0';
        }
        uVar4 = (long)__dq_head_00 - (long)w->dq;
        LOCK();
        (pWVar3->ts).v =
             (uVar4 >> 6 & 0xffffffff | (uVar4 & 0xffffffffffffffc0) << 0x1a) + 0x100000000;
        UNLOCK();
        pWVar3->allstolen = '\0';
        w->split = __dq_head + 2;
        w->allstolen = '\0';
      }
      arg_1 = *(mtbdd_refs_task_t *)(*(long *)(in_FS_OFFSET + -0x18) + 0x30);
      mtbdd_refs_mark_s_par_CALL
                (w,__dq_head + 2,arg_1,
                 *(long *)(*(long *)(in_FS_OFFSET + -0x18) + 0x40) - (long)arg_1 >> 4);
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head_00)) {
        __dq_head[1].thief = (_Worker *)0x0;
        mtbdd_refs_mark_r_par_CALL
                  (w,__dq_head_00,*(MTBDD **)__dq_head[1].d,*(size_t *)(__dq_head[1].d + 8));
      }
      else {
        mtbdd_refs_mark_r_par_SYNC_SLOW(w,__dq_head_00);
      }
      if ((w->_public->movesplit == '\0') && (w->split <= __dq_head)) {
        __dq_head->thief = (_Worker *)0x0;
        mtbdd_refs_mark_p_par_CALL
                  (w,__dq_head,*(MTBDD ***)__dq_head->d,*(size_t *)(__dq_head->d + 8));
        return;
      }
      mtbdd_refs_mark_p_par_SYNC_SLOW(w,__dq_head);
      return;
    }
  }
  lace_abort_stack_overflow();
}

Assistant:

VOID_TASK_0(mtbdd_refs_mark_task)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    SPAWN(mtbdd_refs_mark_p_par, mtbdd_refs_key->pbegin, mtbdd_refs_key->pcur-mtbdd_refs_key->pbegin);
    SPAWN(mtbdd_refs_mark_r_par, mtbdd_refs_key->rbegin, mtbdd_refs_key->rcur-mtbdd_refs_key->rbegin);
    CALL(mtbdd_refs_mark_s_par, mtbdd_refs_key->sbegin, mtbdd_refs_key->scur-mtbdd_refs_key->sbegin);
    SYNC(mtbdd_refs_mark_r_par);
    SYNC(mtbdd_refs_mark_p_par);
}